

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetSourceFilePropertyCommand.cxx
# Opt level: O1

bool cmGetSourceFilePropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *prop;
  pointer pbVar1;
  pointer __s1;
  size_type sVar2;
  cmExecutionStatus *status_00;
  bool bVar3;
  int iVar4;
  cmSourceFile *this;
  cmValue cVar5;
  byte bVar6;
  ulong uVar7;
  size_type __rlen;
  bool source_file_target_option_enabled;
  bool bVar8;
  string_view value;
  string_view value_00;
  string file;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> source_file_directory_makefiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_target_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_directories;
  _Any_data local_d8;
  string local_c8;
  PolicyStatus local_a4;
  cmExecutionStatus *local_a0;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  cmMakefile *local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (((long)uVar7 >> 5 != 3) && ((long)uVar7 >> 5 != 5)) {
    local_d8._M_unused._M_object = &local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((string *)local_d8._M_unused._0_8_ != &local_c8) {
      operator_delete(local_d8._M_unused._M_object,(ulong)(local_c8._M_dataplus._M_p + 1));
    }
    bVar6 = 0;
    goto LAB_00386271;
  }
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar8 = false;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s1 = pbVar1[2]._M_dataplus._M_p;
  sVar2 = pbVar1[2]._M_string_length;
  local_a0 = status;
  if (sVar2 == 9) {
    iVar4 = bcmp(__s1,"DIRECTORY",9);
    bVar8 = iVar4 == 0;
  }
  bVar8 = (bool)(uVar7 == 0xa0 & bVar8);
  if (bVar8 == true) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_58,pbVar1 + 3);
    iVar4 = 4;
    source_file_target_option_enabled = false;
  }
  else {
    if (sVar2 == 0x10) {
      iVar4 = bcmp(__s1,"TARGET_DIRECTORY",0x10);
      bVar3 = iVar4 == 0;
    }
    else {
      bVar3 = false;
    }
    iVar4 = 2;
    source_file_target_option_enabled = false;
    if ((uVar7 == 0xa0) && (source_file_target_option_enabled = false, bVar3)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,pbVar1 + 3);
      source_file_target_option_enabled = true;
      iVar4 = 4;
    }
  }
  local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes
                    (local_a0,bVar8,source_file_target_option_enabled,&local_58,&local_78,&local_98)
  ;
  status_00 = local_a0;
  if (bVar3) {
    local_c8.field_2._M_allocated_capacity =
         (size_type)
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    prop = (string *)
           ((long)&(((string *)local_c8.field_2._M_allocated_capacity)->_M_dataplus)._M_p +
           (ulong)(uint)(iVar4 << 5));
    local_c8.field_2._8_8_ =
         *local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
          super__Vector_impl_data._M_start;
    if ((*(long *)((long)&((string *)local_c8.field_2._M_allocated_capacity)->_M_string_length +
                  (ulong)(uint)(iVar4 << 5)) == 9) &&
       (iVar4 = bcmp((prop->_M_dataplus)._M_p,"GENERATED",9), iVar4 == 0)) {
      local_38 = status_00->Makefile;
      local_a4 = cmMakefile::GetPolicyStatus((cmMakefile *)local_c8.field_2._8_8_,CMP0163,false);
      if (WARN < local_a4) {
        local_d8._M_unused._M_function_pointer =
             (_func_void *)local_c8.field_2._M_allocated_capacity;
        local_d8._8_8_ = local_38;
        local_c8._M_string_length =
             (size_type)
             std::
             _Function_handler<bool_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGetSourceFilePropertyCommand.cxx:73:22)>
             ::_M_invoke;
        local_c8._M_dataplus._M_p =
             (pointer)std::
                      _Function_handler<bool_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGetSourceFilePropertyCommand.cxx:73:22)>
                      ::_M_manager;
        bVar3 = GetPropertyCommand::GetSourceFilePropertyGENERATED
                          ((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1,local_38,
                           (function<bool_(bool)> *)&local_d8);
        uVar7 = (ulong)bVar3;
        if ((code *)local_c8._M_dataplus._M_p != (code *)0x0) {
          (*(code *)local_c8._M_dataplus._M_p)(&local_d8,&local_d8,3);
        }
      }
      bVar6 = (byte)uVar7;
      if (WARN < local_a4) goto LAB_00386243;
    }
    SetPropertyCommand::MakeSourceFilePathAbsoluteIfNeeded
              ((string *)&local_d8,status_00,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,
               (bool)(bVar8 | source_file_target_option_enabled));
    this = cmMakefile::GetSource((cmMakefile *)local_c8.field_2._8_8_,(string *)&local_d8,Ambiguous)
    ;
    if (this == (cmSourceFile *)0x0) {
      if ((prop->_M_string_length == 8) &&
         (iVar4 = bcmp((prop->_M_dataplus)._M_p,"LOCATION",8), iVar4 == 0)) {
        this = cmMakefile::CreateSource
                         ((cmMakefile *)local_c8.field_2._8_8_,(string *)&local_d8,false,Ambiguous);
      }
      else {
        this = (cmSourceFile *)0x0;
      }
    }
    if (this == (cmSourceFile *)0x0) {
LAB_0038620b:
      value_00._M_str = "NOTFOUND";
      value_00._M_len = 8;
      cmMakefile::AddDefinition
                (status_00->Makefile,(string *)local_c8.field_2._M_allocated_capacity,value_00);
    }
    else {
      if (prop->_M_string_length == 0) {
        cVar5.Value = (string *)0x0;
      }
      else {
        cVar5 = cmSourceFile::GetPropertyForUser(this,prop);
      }
      if (cVar5.Value == (string *)0x0) goto LAB_0038620b;
      value._M_str = ((cVar5.Value)->_M_dataplus)._M_p;
      value._M_len = (cVar5.Value)->_M_string_length;
      cmMakefile::AddDefinition
                (status_00->Makefile,(string *)local_c8.field_2._M_allocated_capacity,value);
    }
    bVar6 = 1;
    if ((string *)local_d8._M_unused._0_8_ != &local_c8) {
      operator_delete(local_d8._M_unused._M_object,(ulong)(local_c8._M_dataplus._M_p + 1));
    }
  }
  else {
    bVar6 = 0;
  }
LAB_00386243:
  if (local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
LAB_00386271:
  return (bool)(bVar6 & 1);
}

Assistant:

bool cmGetSourceFilePropertyCommand(std::vector<std::string> const& args,
                                    cmExecutionStatus& status)
{
  std::vector<std::string>::size_type args_size = args.size();
  if (args_size != 3 && args_size != 5) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  std::vector<std::string> source_file_directories;
  std::vector<std::string> source_file_target_directories;
  bool source_file_directory_option_enabled = false;
  bool source_file_target_option_enabled = false;

  int property_arg_index = 2;
  if (args[2] == "DIRECTORY"_s && args_size == 5) {
    property_arg_index = 4;
    source_file_directory_option_enabled = true;
    source_file_directories.push_back(args[3]);
  } else if (args[2] == "TARGET_DIRECTORY"_s && args_size == 5) {
    property_arg_index = 4;
    source_file_target_option_enabled = true;
    source_file_target_directories.push_back(args[3]);
  }

  std::vector<cmMakefile*> source_file_directory_makefiles;
  bool file_scopes_handled =
    SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes(
      status, source_file_directory_option_enabled,
      source_file_target_option_enabled, source_file_directories,
      source_file_target_directories, source_file_directory_makefiles);
  if (!file_scopes_handled) {
    return false;
  }

  std::string const& var = args[0];
  std::string const& propName = args[property_arg_index];
  bool source_file_paths_should_be_absolute =
    source_file_directory_option_enabled || source_file_target_option_enabled;
  cmMakefile& directory_makefile = *source_file_directory_makefiles[0];

  // Special handling for GENERATED property.
  // Note: Only, if CMP0163 is set to NEW!
  if (propName == "GENERATED"_s) {
    auto& mf = status.GetMakefile();
    auto cmp0163 = directory_makefile.GetPolicyStatus(cmPolicies::CMP0163);
    bool const cmp0163new =
      cmp0163 != cmPolicies::OLD && cmp0163 != cmPolicies::WARN;
    if (cmp0163new) {
      return GetPropertyCommand::GetSourceFilePropertyGENERATED(
        args[1], mf, [&var, &mf](bool isGenerated) -> bool {
          // Set the value on the original Makefile scope, not the scope of the
          // requested directory.
          mf.AddDefinition(var, (isGenerated) ? cmValue("1") : cmValue("0"));
          return true;
        });
    }
  }

  // Get the source file.
  std::string const file =
    SetPropertyCommand::MakeSourceFilePathAbsoluteIfNeeded(
      status, args[1], source_file_paths_should_be_absolute);
  cmSourceFile* sf = directory_makefile.GetSource(file);

  // for the location we must create a source file first
  if (!sf && propName == "LOCATION"_s) {
    sf = directory_makefile.CreateSource(file);
  }

  if (sf) {
    cmValue prop = nullptr;
    if (!propName.empty()) {
      prop = sf->GetPropertyForUser(propName);
    }
    if (prop) {
      // Set the value on the original Makefile scope, not the scope of the
      // requested directory.
      status.GetMakefile().AddDefinition(var, *prop);
      return true;
    }
  }

  // Set the value on the original Makefile scope, not the scope of the
  // requested directory.
  status.GetMakefile().AddDefinition(var, "NOTFOUND");
  return true;
}